

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O0

size_t re2c::find_state(nfa_state_t **kernel,nfa_state_t **end,ord_hash_set_t *kernels)

{
  size_t size;
  nfa_state_t **p;
  ord_hash_set_t *kernels_local;
  nfa_state_t **end_local;
  nfa_state_t **kernel_local;
  
  size = (size_t)kernel;
  if (kernel == end) {
    kernel_local = (nfa_state_t **)0xffffffffffffffff;
  }
  else {
    for (; (nfa_state_t **)size != end; size = size + 8) {
      *(undefined1 *)(*(long *)size + 0x18) = 0;
    }
    std::sort<re2c::nfa_state_t**>(kernel,end);
    kernel_local = (nfa_state_t **)
                   ord_hash_set_t::insert(kernels,kernel,((long)end - (long)kernel >> 3) << 3);
  }
  return (size_t)kernel_local;
}

Assistant:

static size_t find_state
	( nfa_state_t **kernel
	, nfa_state_t **end
	, ord_hash_set_t &kernels
	)
{
	// zero-sized kernel corresponds to default state
	if (kernel == end)
	{
		return dfa_t::NIL;
	}

	// see note [marking DFA states]
	for (nfa_state_t **p = kernel; p != end; ++p)
	{
		(*p)->mark = false;
	}

	// sort kernel states: we need this to get stable hash
	// and to compare states with simple 'memcmp'
	std::sort(kernel, end);
	const size_t size = static_cast<size_t>(end - kernel) * sizeof(nfa_state_t*);
	return kernels.insert(kernel, size);
}